

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> __thiscall
kj::_::EagerPromiseNodeBase::fire(EagerPromiseNodeBase *this)

{
  PromiseArenaMember *node;
  Event *extraout_RDX;
  long in_RSI;
  Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> MVar1;
  
  (**(code **)(**(long **)(in_RSI + 0x50) + 0x18))
            (*(long **)(in_RSI + 0x50),*(undefined8 *)(in_RSI + 0x60));
  node = *(PromiseArenaMember **)(in_RSI + 0x50);
  if (node != (PromiseArenaMember *)0x0) {
    *(undefined8 *)(in_RSI + 0x50) = 0;
    PromiseDisposer::dispose(node);
  }
  PromiseNode::OnReadyEvent::arm((OnReadyEvent *)(in_RSI + 0x58));
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)0x0;
  (this->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
  MVar1.ptr.ptr = extraout_RDX;
  MVar1.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>)MVar1.ptr;
}

Assistant:

Maybe<Own<Event>> EagerPromiseNodeBase::fire() {
  dependency->get(resultRef);
  KJ_IF_SOME(exception, kj::runCatchingExceptions([this]() {
    dependency = nullptr;
  })) {
    resultRef.addException(kj::mv(exception));
  }

  onReadyEvent.arm();
  return kj::none;
}